

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  Flags FVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  MatcherDescriberInterface *pMVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long *local_60;
  string local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  FVar1 = this->match_flags_;
  if (FVar1 == Superset) {
    pcVar8 = "no surjection from elements to requirements exists such that:\n";
    lVar9 = 0x3e;
  }
  else {
    if (FVar1 != Subset) {
      if (FVar1 == ExactMatch) {
        ppMVar2 = (this->matcher_describers_).
                  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar3 = (this->matcher_describers_).
                  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar2 == ppMVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"isn\'t empty",0xb);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"doesn\'t have ",0xd);
        if ((long)ppMVar3 - (long)ppMVar2 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)&local_60,1);
          Message::GetString_abi_cxx11_(&local_58,(Message *)&local_60);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_58._M_dataplus._M_p,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", or has ",9);
          Elements((UnorderedElementsAreMatcherImplBase *)&local_38,1);
          Message::GetString_abi_cxx11_(&local_58,(Message *)&local_38);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," that ",6);
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
          if (local_60 != (long *)0x0) {
            (**(code **)(*local_60 + 8))();
          }
          pMVar4 = *(this->matcher_describers_).
                    super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (*pMVar4->_vptr_MatcherDescriberInterface[3])(pMVar4,os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)&local_60,
                 (long)(this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        Message::GetString_abi_cxx11_(&local_58,(Message *)&local_60);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_58._M_dataplus._M_p,local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,", or there exists no permutation of elements such that:\n",0x38);
        if (local_60 != (long *)0x0) {
          (**(code **)(*local_60 + 8))();
        }
      }
      goto LAB_01039364;
    }
    pcVar8 = "no injection from elements to requirements exists such that:\n";
    lVar9 = 0x3d;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,lVar9);
LAB_01039364:
  if ((this->matcher_describers_).
      super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matcher_describers_).
      super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar8 = anon_var_dwarf_a22956 + 5;
    lVar9 = 0;
    do {
      sVar6 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,sVar6);
      if (this->match_flags_ == ExactMatch) {
        std::__ostream_insert<char,std::char_traits<char>>(os," - element #",0xc);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        lVar7 = 1;
        pcVar8 = " ";
      }
      else {
        lVar7 = 0xe;
        pcVar8 = " - an element ";
        poVar5 = os;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
      pMVar4 = (this->matcher_describers_).
               super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9];
      (*pMVar4->_vptr_MatcherDescriberInterface[2])(pMVar4,os);
      pcVar8 = "\n";
      if (this->match_flags_ == ExactMatch) {
        pcVar8 = ", and\n";
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != (long)(this->matcher_describers_).
                            super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->matcher_describers_).
                            super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "isn't empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "doesn't have " << Elements(1) << ", or has " << Elements(1)
            << " that ";
        matcher_describers_[0]->DescribeNegationTo(os);
        return;
      }
      *os << "doesn't have " << Elements(matcher_describers_.size())
          << ", or there exists no permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "no surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "no injection from elements to requirements exists such that:\n";
      break;
  }
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}